

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_list * mg_list_alloc(uint32_t size,mg_allocator *allocator)

{
  mg_list *list;
  char *block;
  size_t elements_size;
  size_t in_stack_ffffffffffffffc8;
  mg_allocator *in_stack_ffffffffffffffd0;
  mg_list *local_8;
  
  local_8 = (mg_list *)mg_allocator_malloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_8 == (mg_list *)0x0) {
    local_8 = (mg_list *)0x0;
  }
  else {
    local_8->elements = (mg_value **)(local_8 + 1);
  }
  return local_8;
}

Assistant:

mg_list *mg_list_alloc(uint32_t size, mg_allocator *allocator) {
  size_t elements_size = size * sizeof(mg_value *);
  char *block = mg_allocator_malloc(allocator, sizeof(mg_list) + elements_size);
  if (!block) {
    return NULL;
  }
  mg_list *list = (mg_list *)block;
  list->elements = (mg_value **)(block + sizeof(mg_list));
  return list;
}